

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseStatement(ParseContext *ctx)

{
  SynFunctionDefinition *pSVar1;
  SynVariableDefinitions *pSVar2;
  
  pSVar1 = (SynFunctionDefinition *)ParseClassDefinition(ctx);
  if (pSVar1 == (SynFunctionDefinition *)0x0) {
    pSVar1 = (SynFunctionDefinition *)ParseEnumDefinition(ctx);
    if (pSVar1 == (SynFunctionDefinition *)0x0) {
      pSVar1 = (SynFunctionDefinition *)ParseNamespaceDefinition(ctx);
      if (pSVar1 == (SynFunctionDefinition *)0x0) {
        pSVar1 = (SynFunctionDefinition *)ParseReturn(ctx);
        if (pSVar1 == (SynFunctionDefinition *)0x0) {
          pSVar1 = (SynFunctionDefinition *)ParseYield(ctx);
          if (pSVar1 == (SynFunctionDefinition *)0x0) {
            pSVar1 = (SynFunctionDefinition *)ParseBreak(ctx);
            if (pSVar1 == (SynFunctionDefinition *)0x0) {
              pSVar1 = (SynFunctionDefinition *)ParseContinue(ctx);
              if (pSVar1 == (SynFunctionDefinition *)0x0) {
                pSVar1 = (SynFunctionDefinition *)ParseTypedef(ctx);
                if (pSVar1 == (SynFunctionDefinition *)0x0) {
                  pSVar1 = (SynFunctionDefinition *)ParseBlock(ctx);
                  if (pSVar1 == (SynFunctionDefinition *)0x0) {
                    pSVar1 = (SynFunctionDefinition *)ParseIfElse(ctx,false);
                    if (pSVar1 == (SynFunctionDefinition *)0x0) {
                      pSVar1 = (SynFunctionDefinition *)ParseForEach(ctx);
                      if (pSVar1 == (SynFunctionDefinition *)0x0) {
                        pSVar1 = (SynFunctionDefinition *)ParseFor(ctx);
                        if (pSVar1 == (SynFunctionDefinition *)0x0) {
                          pSVar1 = (SynFunctionDefinition *)ParseWhile(ctx);
                          if (pSVar1 == (SynFunctionDefinition *)0x0) {
                            pSVar1 = (SynFunctionDefinition *)ParseDoWhile(ctx);
                            if (pSVar1 == (SynFunctionDefinition *)0x0) {
                              pSVar1 = (SynFunctionDefinition *)ParseSwitch(ctx);
                              if (pSVar1 == (SynFunctionDefinition *)0x0) {
                                pSVar1 = ParseFunctionDefinition(ctx);
                                if (pSVar1 == (SynFunctionDefinition *)0x0) {
                                  pSVar2 = ParseVariableDefinitions(ctx,false);
                                  return &pSVar2->super_SynBase;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return &pSVar1->super_SynBase;
}

Assistant:

SynBase* ParseStatement(ParseContext &ctx)
{
	if(SynBase *node = ParseClassDefinition(ctx))
		return node;

	if(SynBase *node = ParseEnumDefinition(ctx))
		return node;

	if(SynBase *node = ParseNamespaceDefinition(ctx))
		return node;

	if(SynBase *node = ParseReturn(ctx))
		return node;

	if(SynBase *node = ParseYield(ctx))
		return node;

	if(SynBase *node = ParseBreak(ctx))
		return node;

	if(SynBase *node = ParseContinue(ctx))
		return node;

	if(SynBase *node = ParseTypedef(ctx))
		return node;

	if(SynBase *node = ParseBlock(ctx))
		return node;

	if(SynBase *node = ParseIfElse(ctx, false))
		return node;

	if(SynBase *node = ParseForEach(ctx))
		return node;

	if(SynBase *node = ParseFor(ctx))
		return node;

	if(SynBase *node = ParseWhile(ctx))
		return node;

	if(SynBase *node = ParseDoWhile(ctx))
		return node;

	if(SynBase *node = ParseSwitch(ctx))
		return node;

	if(SynBase *node = ParseFunctionDefinition(ctx))
		return node;

	if(SynBase *node = ParseVariableDefinitions(ctx, false))
		return node;

	return NULL;
}